

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O1

void printAddSubImm(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  MCOperand *pMVar4;
  int64_t iVar5;
  ulong uVar6;
  
  pMVar4 = MCInst_getOperand(MI,OpNum);
  _Var3 = MCOperand_isImm(pMVar4);
  if (_Var3) {
    iVar5 = MCOperand_getImm(pMVar4);
    pMVar4 = MCInst_getOperand(MI,OpNum + 1);
    uVar6 = MCOperand_getImm(pMVar4);
    printInt32Bang(O,(uint)iVar5 & 0xfff);
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x2e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      *(ulong *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.opcode[2] * 0x30) + 0x36) =
           (ulong)((uint)iVar5 & 0xfff);
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
    }
    if ((uVar6 & 0x3f) != 0) {
      printShifter(MI,OpNum + 1,O);
      return;
    }
  }
  return;
}

Assistant:

static void printAddSubImm(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	if (MCOperand_isImm(MO)) {
		unsigned Val = (MCOperand_getImm(MO) & 0xfff);
		//assert(Val == MO.getImm() && "Add/sub immediate out of range!");
		unsigned Shift = AArch64_AM_getShiftValue((int)MCOperand_getImm(MCInst_getOperand(MI, OpNum + 1)));

		printInt32Bang(O, Val);

		if (MI->csh->detail) {
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = Val;
			MI->flat_insn->detail->arm64.op_count++;
		}

		if (Shift != 0)
			printShifter(MI, OpNum + 1, O);
	}
}